

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O2

void panel_line(panel *p,uint8_t attr,char *label,char *fmt,...)

{
  panel_line *ppVar1;
  size_t sVar2;
  uint __line;
  char in_AL;
  char *__assertion;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vp;
  undefined1 local_b8 [32];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_98 = in_R8;
  local_90 = in_R9;
  if (p == (panel *)0x0) {
    __assertion = "p";
    __line = 100;
  }
  else {
    sVar2 = p->len;
    if (sVar2 != p->max) {
      p->len = sVar2 + 1;
      ppVar1 = p->lines + sVar2;
      ppVar1->attr = attr;
      ppVar1->label = label;
      vp[0].reg_save_area = local_b8;
      vp[0].overflow_arg_area = &stack0x00000008;
      vp[0].gp_offset = 0x20;
      vp[0].fp_offset = 0x30;
      vstrnfmt(ppVar1->value,0x14,fmt,vp);
      return;
    }
    __assertion = "p->len != p->max";
    __line = 0x65;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-player.c"
                ,__line,"void panel_line(struct panel *, uint8_t, const char *, const char *, ...)")
  ;
}

Assistant:

static void panel_line(struct panel *p, uint8_t attr, const char *label,
		const char *fmt, ...) {
	va_list vp;

	struct panel_line *pl;

	/* Get the next panel line */
	assert(p);
	assert(p->len != p->max);
	pl = &p->lines[p->len++];

	/* Set the basics */
	pl->attr = attr;
	pl->label = label;

	/* Set the value */
	va_start(vp, fmt);
	vstrnfmt(pl->value, sizeof pl->value, fmt, vp);
	va_end(vp);
}